

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::outputAggRegTupleString_abi_cxx11_
          (CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,bitset<7UL> *increasing,
          size_t stringOffset,bool postLoop)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  long in_RCX;
  long in_RDX;
  string *in_RDI;
  byte in_stack_00000008;
  size_t k_7;
  size_t aggID_1;
  size_t viewID_1;
  size_t k_6;
  size_t k_5;
  size_t k_4;
  size_t i;
  string k_3;
  string aggID;
  size_t viewID;
  string k_2;
  string k_1;
  string k;
  string *outString;
  size_t in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff720;
  byte in_stack_fffffffffffff721;
  byte in_stack_fffffffffffff722;
  undefined1 in_stack_fffffffffffff723;
  undefined1 in_stack_fffffffffffff724;
  byte in_stack_fffffffffffff725;
  undefined1 in_stack_fffffffffffff726;
  byte in_stack_fffffffffffff727;
  undefined1 in_stack_fffffffffffff728;
  byte in_stack_fffffffffffff729;
  undefined1 in_stack_fffffffffffff72a;
  byte in_stack_fffffffffffff72b;
  undefined1 in_stack_fffffffffffff72c;
  undefined1 in_stack_fffffffffffff72d;
  undefined1 in_stack_fffffffffffff72e;
  undefined1 in_stack_fffffffffffff72f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  CppGenerator *in_stack_fffffffffffff758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  string local_888 [32];
  string local_868 [32];
  long local_848;
  reference local_840;
  reference local_830;
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  long local_780;
  undefined8 local_778;
  reference local_770;
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  long local_700;
  reference local_6f8;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  long local_688;
  reference local_680;
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  long local_610;
  reference local_608;
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  ulong local_4b8;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  reference local_450;
  reference local_440;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  undefined8 local_390;
  reference local_388;
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  reference local_318;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  reference local_2a8;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  reference local_238;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [53];
  undefined1 local_33 [51];
  
  local_33[2] = in_stack_00000008 & 1;
  local_33[1] = 0;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_33;
  local_33._19_8_ = in_RCX;
  local_33._27_8_ = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_33);
  if (local_33._19_8_ + 1 < 3) {
    for (local_4b8 = 0; local_4b8 < local_33._19_8_ + 1; local_4b8 = local_4b8 + 1) {
      if ((local_33[2] & 1) == 0) {
        offset_abi_cxx11_(in_stack_fffffffffffff758,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff758,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_578);
        std::__cxx11::string::~string(local_578);
        std::__cxx11::string::~string(local_598);
        std::__cxx11::string::~string(local_5f8);
        std::__cxx11::string::~string(local_5b8);
        std::__cxx11::string::~string(local_5d8);
      }
      else {
        offset_abi_cxx11_(in_stack_fffffffffffff758,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff758,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_4d8);
        std::__cxx11::string::~string(local_4d8);
        std::__cxx11::string::~string(local_4f8);
        std::__cxx11::string::~string(local_558);
        std::__cxx11::string::~string(local_518);
        std::__cxx11::string::~string(local_538);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff72b =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_608);
      if ((in_stack_fffffffffffff72b & 1) != 0) {
        local_610 = *(long *)(local_33._27_8_ + 8);
        in_stack_fffffffffffff72a =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff72a) {
          local_610 = local_4b8 + local_610;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffff72f,
                                        CONCAT16(in_stack_fffffffffffff72e,
                                                 CONCAT15(in_stack_fffffffffffff72d,
                                                          CONCAT14(in_stack_fffffffffffff72c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff72b,
                                                  CONCAT12(in_stack_fffffffffffff72a,
                                                           CONCAT11(in_stack_fffffffffffff729,
                                                                    in_stack_fffffffffffff728)))))))
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_630);
        std::__cxx11::string::~string(local_630);
        std::__cxx11::string::~string(local_650);
        std::__cxx11::string::~string(local_670);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff729 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_680);
      if ((in_stack_fffffffffffff729 & 1) != 0) {
        local_688 = *(long *)(local_33._27_8_ + 0x10);
        in_stack_fffffffffffff728 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff728) {
          local_688 = local_4b8 + local_688;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffff72f,
                                        CONCAT16(in_stack_fffffffffffff72e,
                                                 CONCAT15(in_stack_fffffffffffff72d,
                                                          CONCAT14(in_stack_fffffffffffff72c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff72b,
                                                  CONCAT12(in_stack_fffffffffffff72a,
                                                           CONCAT11(in_stack_fffffffffffff729,
                                                                    in_stack_fffffffffffff728)))))))
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_6a8);
        std::__cxx11::string::~string(local_6a8);
        std::__cxx11::string::~string(local_6c8);
        std::__cxx11::string::~string(local_6e8);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff727 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_6f8);
      if ((in_stack_fffffffffffff727 & 1) != 0) {
        local_700 = *(long *)(local_33._27_8_ + 0x18);
        in_stack_fffffffffffff726 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff726) {
          local_700 = local_4b8 + local_700;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffff72f,
                                        CONCAT16(in_stack_fffffffffffff72e,
                                                 CONCAT15(in_stack_fffffffffffff72d,
                                                          CONCAT14(in_stack_fffffffffffff72c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff72b,
                                                  CONCAT12(in_stack_fffffffffffff72a,
                                                           CONCAT11(in_stack_fffffffffffff729,
                                                                    in_stack_fffffffffffff728)))))))
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_720);
        std::__cxx11::string::~string(local_720);
        std::__cxx11::string::~string(local_740);
        std::__cxx11::string::~string(local_760);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff725 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_770);
      if ((in_stack_fffffffffffff725 & 1) != 0) {
        local_778 = *(undefined8 *)(local_33._27_8_ + 0x20);
        in_stack_fffffffffffff724 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff724) {
          std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
          exit(1);
        }
        local_780 = *(long *)(local_33._27_8_ + 0x28);
        in_stack_fffffffffffff723 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff723) {
          local_780 = local_4b8 + local_780;
        }
        std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff758,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_7a0);
        std::__cxx11::string::~string(local_7a0);
        std::__cxx11::string::~string(local_7c0);
        std::__cxx11::string::~string(local_820);
        std::__cxx11::string::~string(local_7e0);
        std::__cxx11::string::~string(local_800);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff722 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_830);
      if ((in_stack_fffffffffffff722 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,"count*");
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffff72f,
                          CONCAT16(in_stack_fffffffffffff72e,
                                   CONCAT15(in_stack_fffffffffffff72d,
                                            CONCAT14(in_stack_fffffffffffff72c,
                                                     CONCAT13(in_stack_fffffffffffff72b,
                                                              CONCAT12(in_stack_fffffffffffff72a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                 CONCAT17(in_stack_fffffffffffff727,
                          CONCAT16(in_stack_fffffffffffff726,
                                   CONCAT15(in_stack_fffffffffffff725,
                                            CONCAT14(in_stack_fffffffffffff724,
                                                     CONCAT13(in_stack_fffffffffffff723,
                                                              CONCAT12(in_stack_fffffffffffff722,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      in_stack_fffffffffffff721 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::bitset<7UL>::reference::~reference(&local_840);
      if ((in_stack_fffffffffffff721 & 1) != 0) {
        local_848 = *(long *)(local_33._27_8_ + 0x38);
        in_stack_fffffffffffff720 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                        in_stack_fffffffffffff718);
        if ((bool)in_stack_fffffffffffff720) {
          local_848 = local_4b8 + local_848;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffff72f,
                                        CONCAT16(in_stack_fffffffffffff72e,
                                                 CONCAT15(in_stack_fffffffffffff72d,
                                                          CONCAT14(in_stack_fffffffffffff72c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff72b,
                                                  CONCAT12(in_stack_fffffffffffff72a,
                                                           CONCAT11(in_stack_fffffffffffff729,
                                                                    in_stack_fffffffffffff728)))))))
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffff727,
                                 CONCAT16(in_stack_fffffffffffff726,
                                          CONCAT15(in_stack_fffffffffffff725,
                                                   CONCAT14(in_stack_fffffffffffff724,
                                                            CONCAT13(in_stack_fffffffffffff723,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff72f,
                                CONCAT16(in_stack_fffffffffffff72e,
                                         CONCAT15(in_stack_fffffffffffff72d,
                                                  CONCAT14(in_stack_fffffffffffff72c,
                                                           CONCAT13(in_stack_fffffffffffff72b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff72a,
                                                  CONCAT11(in_stack_fffffffffffff729,
                                                           in_stack_fffffffffffff728))))))),
                       (char *)CONCAT17(in_stack_fffffffffffff727,
                                        CONCAT16(in_stack_fffffffffffff726,
                                                 CONCAT15(in_stack_fffffffffffff725,
                                                          CONCAT14(in_stack_fffffffffffff724,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff723,
                                                  CONCAT12(in_stack_fffffffffffff722,
                                                           CONCAT11(in_stack_fffffffffffff721,
                                                                    in_stack_fffffffffffff720)))))))
                      );
        std::__cxx11::string::operator+=((string *)in_RDI,local_868);
        std::__cxx11::string::~string(local_868);
        std::__cxx11::string::~string(local_888);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff758);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    }
  }
  else {
    offset_abi_cxx11_(in_stack_fffffffffffff758,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff72f,
                            CONCAT16(in_stack_fffffffffffff72e,
                                     CONCAT15(in_stack_fffffffffffff72d,
                                              CONCAT14(in_stack_fffffffffffff72c,
                                                       CONCAT13(in_stack_fffffffffffff72b,
                                                                CONCAT12(in_stack_fffffffffffff72a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                   (char *)CONCAT17(in_stack_fffffffffffff727,
                                    CONCAT16(in_stack_fffffffffffff726,
                                             CONCAT15(in_stack_fffffffffffff725,
                                                      CONCAT14(in_stack_fffffffffffff724,
                                                               CONCAT13(in_stack_fffffffffffff723,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff758,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff72f,
                            CONCAT16(in_stack_fffffffffffff72e,
                                     CONCAT15(in_stack_fffffffffffff72d,
                                              CONCAT14(in_stack_fffffffffffff72c,
                                                       CONCAT13(in_stack_fffffffffffff72b,
                                                                CONCAT12(in_stack_fffffffffffff72a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                   (char *)CONCAT17(in_stack_fffffffffffff727,
                                    CONCAT16(in_stack_fffffffffffff726,
                                             CONCAT15(in_stack_fffffffffffff725,
                                                      CONCAT14(in_stack_fffffffffffff724,
                                                               CONCAT13(in_stack_fffffffffffff723,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::__cxx11::string::operator+=((string *)in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    if ((local_33[2] & 1) == 0) {
      offset_abi_cxx11_(in_stack_fffffffffffff758,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff758,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_1a8);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
    }
    else {
      offset_abi_cxx11_(in_stack_fffffffffffff758,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff758,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_108);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_168);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(in_stack_fffffffffffff72e,
                                 CONCAT15(in_stack_fffffffffffff72d,
                                          CONCAT14(in_stack_fffffffffffff72c,
                                                   CONCAT13(in_stack_fffffffffffff72b,
                                                            CONCAT12(in_stack_fffffffffffff72a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar1 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_238);
    if (bVar1) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      bVar1 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)
                         CONCAT17(in_stack_fffffffffffff727,
                                  CONCAT16(in_stack_fffffffffffff726,
                                           CONCAT15(in_stack_fffffffffffff725,
                                                    CONCAT14(in_stack_fffffffffffff724,
                                                             CONCAT13(in_stack_fffffffffffff723,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                         in_stack_fffffffffffff718);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_258,"+i");
      }
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_278);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_258);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(in_stack_fffffffffffff72e,
                                 CONCAT15(in_stack_fffffffffffff72d,
                                          CONCAT14(in_stack_fffffffffffff72c,
                                                   CONCAT13(in_stack_fffffffffffff72b,
                                                            CONCAT12(in_stack_fffffffffffff72a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar1 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_2a8);
    if (bVar1) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      bVar1 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)
                         CONCAT17(in_stack_fffffffffffff727,
                                  CONCAT16(in_stack_fffffffffffff726,
                                           CONCAT15(in_stack_fffffffffffff725,
                                                    CONCAT14(in_stack_fffffffffffff724,
                                                             CONCAT13(in_stack_fffffffffffff723,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                         in_stack_fffffffffffff718);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_2c8,"+i");
      }
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_2e8);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_2c8);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(in_stack_fffffffffffff72e,
                                 CONCAT15(in_stack_fffffffffffff72d,
                                          CONCAT14(in_stack_fffffffffffff72c,
                                                   CONCAT13(in_stack_fffffffffffff72b,
                                                            CONCAT12(in_stack_fffffffffffff72a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar1 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_318);
    if (bVar1) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      bVar1 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)
                         CONCAT17(in_stack_fffffffffffff727,
                                  CONCAT16(in_stack_fffffffffffff726,
                                           CONCAT15(in_stack_fffffffffffff725,
                                                    CONCAT14(in_stack_fffffffffffff724,
                                                             CONCAT13(in_stack_fffffffffffff723,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                         in_stack_fffffffffffff718);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_338,"+i");
      }
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_358);
      std::__cxx11::string::~string(local_358);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string(local_338);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(in_stack_fffffffffffff72e,
                                 CONCAT15(in_stack_fffffffffffff72d,
                                          CONCAT14(in_stack_fffffffffffff72c,
                                                   CONCAT13(in_stack_fffffffffffff72b,
                                                            CONCAT12(in_stack_fffffffffffff72a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar1 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_388);
    if (bVar1) {
      local_390 = *(undefined8 *)(local_33._27_8_ + 0x20);
      bVar1 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)
                         CONCAT17(in_stack_fffffffffffff727,
                                  CONCAT16(in_stack_fffffffffffff726,
                                           CONCAT15(in_stack_fffffffffffff725,
                                                    CONCAT14(in_stack_fffffffffffff724,
                                                             CONCAT13(in_stack_fffffffffffff723,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                         in_stack_fffffffffffff718);
      if (bVar1) {
        std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
        exit(1);
      }
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      in_stack_fffffffffffff72f =
           std::bitset<7UL>::operator[]
                     ((bitset<7UL> *)
                      CONCAT17(in_stack_fffffffffffff727,
                               CONCAT16(in_stack_fffffffffffff726,
                                        CONCAT15(in_stack_fffffffffffff725,
                                                 CONCAT14(in_stack_fffffffffffff724,
                                                          CONCAT13(in_stack_fffffffffffff723,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                      in_stack_fffffffffffff718);
      if ((bool)in_stack_fffffffffffff72f) {
        std::__cxx11::string::operator+=(local_3b0,"+i");
      }
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff727,
                              CONCAT16(in_stack_fffffffffffff726,
                                       CONCAT15(in_stack_fffffffffffff725,
                                                CONCAT14(in_stack_fffffffffffff724,
                                                         CONCAT13(in_stack_fffffffffffff723,
                                                                  CONCAT12(in_stack_fffffffffffff722
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(in_stack_fffffffffffff72e,
                                       CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
                     (char *)CONCAT17(in_stack_fffffffffffff727,
                                      CONCAT16(in_stack_fffffffffffff726,
                                               CONCAT15(in_stack_fffffffffffff725,
                                                        CONCAT14(in_stack_fffffffffffff724,
                                                                 CONCAT13(in_stack_fffffffffffff723,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_3d0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::~string(local_3f0);
      std::__cxx11::string::~string(local_410);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::string::~string(local_3b0);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(in_stack_fffffffffffff72e,
                                 CONCAT15(in_stack_fffffffffffff72d,
                                          CONCAT14(in_stack_fffffffffffff72c,
                                                   CONCAT13(in_stack_fffffffffffff72b,
                                                            CONCAT12(in_stack_fffffffffffff72a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar2 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_440);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"count*");
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffff72f,
                        CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffff72d,
                                                CONCAT14(in_stack_fffffffffffff72c,
                                                         CONCAT13(in_stack_fffffffffffff72b,
                                                                  CONCAT12(in_stack_fffffffffffff72a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff729,
                                                  in_stack_fffffffffffff728))))))),
               CONCAT17(in_stack_fffffffffffff727,
                        CONCAT16(in_stack_fffffffffffff726,
                                 CONCAT15(in_stack_fffffffffffff725,
                                          CONCAT14(in_stack_fffffffffffff724,
                                                   CONCAT13(in_stack_fffffffffffff723,
                                                            CONCAT12(in_stack_fffffffffffff722,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff721,
                                                  in_stack_fffffffffffff720))))))));
    bVar3 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)
                       CONCAT17(in_stack_fffffffffffff727,
                                CONCAT16(in_stack_fffffffffffff726,
                                         CONCAT15(in_stack_fffffffffffff725,
                                                  CONCAT14(in_stack_fffffffffffff724,
                                                           CONCAT13(in_stack_fffffffffffff723,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
    std::bitset<7UL>::reference::~reference(&local_450);
    if ((bVar3 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff758);
      uVar4 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)
                         CONCAT17(in_stack_fffffffffffff727,
                                  CONCAT16(in_stack_fffffffffffff726,
                                           CONCAT15(in_stack_fffffffffffff725,
                                                    CONCAT14(in_stack_fffffffffffff724,
                                                             CONCAT13(in_stack_fffffffffffff723,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))),
                         in_stack_fffffffffffff718);
      if ((bool)uVar4) {
        std::__cxx11::string::operator+=(local_470,"+i");
      }
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff72f,
                              CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(uVar4,CONCAT13(
                                                  in_stack_fffffffffffff72b,
                                                  CONCAT12(in_stack_fffffffffffff72a,
                                                           CONCAT11(in_stack_fffffffffffff729,
                                                                    in_stack_fffffffffffff728)))))))
                     ,(char *)CONCAT17(in_stack_fffffffffffff727,
                                       CONCAT16(in_stack_fffffffffffff726,
                                                CONCAT15(in_stack_fffffffffffff725,
                                                         CONCAT14(in_stack_fffffffffffff724,
                                                                  CONCAT13(in_stack_fffffffffffff723
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffff722,
                                                  CONCAT11(in_stack_fffffffffffff721,
                                                           in_stack_fffffffffffff720))))))));
      std::__cxx11::string::operator+=((string *)in_RDI,local_490);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string(local_4b0);
      std::__cxx11::string::~string(local_470);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::operator+=((string *)in_RDI,";\n");
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::outputAggRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset, bool postLoop)
{  
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        if (postLoop)
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] = ";
        else 
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] += ";

        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="localRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            outString +="viewRegister["+k+"]*";
        }
        if (idx.present[3])
        {
            // TODO: CHECK THAT index 4 is also presenth
            size_t viewID = idx.indexes[3];                
            if (increasing[3])
            {
                ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                exit(1);
            }
            
            std::string aggID = std::to_string(idx.indexes[4]);
            if (increasing[4])
                aggID += "+i";

            outString += "aggregates_"+viewName[viewID]+"["+aggID+"]*";
        }

        if (idx.present[5])
            outString +=  "count*";

        if (idx.present[6])
        {
            std::string k = std::to_string(idx.indexes[6]);            
            if (increasing[6])
                k += "+i";
            outString += "aggregateRegister["+k+"]*";
        }

        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            if (postLoop)
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] = ";
            else
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] += ";

            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="localRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                outString +="viewRegister["+std::to_string(k)+"]*";
            }
            if (idx.present[3])
            {
                // TODO: CHECK THAT index 4 is also presenth
                size_t viewID = idx.indexes[3];                
                if (increasing[3])
                {
                    ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                    exit(1);
                }

                size_t aggID = idx.indexes[4];
                if (increasing[4])
                    aggID += i;

                outString += "aggregates_"+viewName[viewID]+"["+
                    std::to_string(aggID)+"]*";
            }

            if (idx.present[5])
                outString +=  "count*";

            if (idx.present[6])
            {
                size_t k = idx.indexes[6];
                if (increasing[6])
                    k += i;
                outString += "aggregateRegister["+std::to_string(k)+"]*";
            }

            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}